

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall
ParseFloat_RoundingSpec_Test::~ParseFloat_RoundingSpec_Test(ParseFloat_RoundingSpec_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ParseFloat, RoundingSpec) {
  static const struct {
    const char* input;
    uint32_t output;
  } kTests[] = {
    {"+0x1.00000100000000000p-50", 0x26800000},
    {"-0x1.00000100000000000p-50", 0xa6800000},
    {"+0x1.00000100000000001p-50", 0x26800001},
    {"-0x1.00000100000000001p-50", 0xa6800001},
    {"+0x1.000001fffffffffffp-50", 0x26800001},
    {"-0x1.000001fffffffffffp-50", 0xa6800001},
    {"+0x1.00000200000000000p-50", 0x26800001},
    {"-0x1.00000200000000000p-50", 0xa6800001},
    {"+0x1.00000200000000001p-50", 0x26800001},
    {"-0x1.00000200000000001p-50", 0xa6800001},
    {"+0x1.000002fffffffffffp-50", 0x26800001},
    {"-0x1.000002fffffffffffp-50", 0xa6800001},
    {"+0x1.00000300000000000p-50", 0x26800002},
    {"-0x1.00000300000000000p-50", 0xa6800002},
    {"+0x1.00000300000000001p-50", 0x26800002},
    {"-0x1.00000300000000001p-50", 0xa6800002},
    {"+0x1.000003fffffffffffp-50", 0x26800002},
    {"-0x1.000003fffffffffffp-50", 0xa6800002},
    {"+0x1.00000400000000000p-50", 0x26800002},
    {"-0x1.00000400000000000p-50", 0xa6800002},
    {"+0x1.00000400000000001p-50", 0x26800002},
    {"-0x1.00000400000000001p-50", 0xa6800002},
    {"+0x1.000004fffffffffffp-50", 0x26800002},
    {"-0x1.000004fffffffffffp-50", 0xa6800002},
    {"+0x1.00000500000000000p-50", 0x26800002},
    {"-0x1.00000500000000000p-50", 0xa6800002},
    {"+0x1.00000500000000001p-50", 0x26800003},
    {"-0x1.00000500000000001p-50", 0xa6800003},
    {"+0x4000.004000000p-64", 0x26800000},
    {"-0x4000.004000000p-64", 0xa6800000},
    {"+0x4000.004000001p-64", 0x26800001},
    {"-0x4000.004000001p-64", 0xa6800001},
    {"+0x4000.007ffffffp-64", 0x26800001},
    {"-0x4000.007ffffffp-64", 0xa6800001},
    {"+0x4000.008000000p-64", 0x26800001},
    {"-0x4000.008000000p-64", 0xa6800001},
    {"+0x4000.008000001p-64", 0x26800001},
    {"-0x4000.008000001p-64", 0xa6800001},
    {"+0x4000.00bffffffp-64", 0x26800001},
    {"-0x4000.00bffffffp-64", 0xa6800001},
    {"+0x4000.00c000000p-64", 0x26800002},
    {"-0x4000.00c000000p-64", 0xa6800002},
    {"+0x4000.00c000001p-64", 0x26800002},
    {"-0x4000.00c000001p-64", 0xa6800002},
    {"+0x4000.00fffffffp-64", 0x26800002},
    {"-0x4000.00fffffffp-64", 0xa6800002},
    {"+0x4000.010000001p-64", 0x26800002},
    {"-0x4000.010000001p-64", 0xa6800002},
    {"+0x4000.013ffffffp-64", 0x26800002},
    {"-0x4000.013ffffffp-64", 0xa6800002},
    {"+0x4000.014000001p-64", 0x26800003},
    {"-0x4000.014000001p-64", 0xa6800003},
    {"+0x1.00000100000000000p+50", 0x58800000},
    {"-0x1.00000100000000000p+50", 0xd8800000},
    {"+0x1.00000100000000001p+50", 0x58800001},
    {"-0x1.00000100000000001p+50", 0xd8800001},
    {"+0x1.000001fffffffffffp+50", 0x58800001},
    {"-0x1.000001fffffffffffp+50", 0xd8800001},
    {"+0x1.00000200000000000p+50", 0x58800001},
    {"-0x1.00000200000000000p+50", 0xd8800001},
    {"+0x1.00000200000000001p+50", 0x58800001},
    {"-0x1.00000200000000001p+50", 0xd8800001},
    {"+0x1.000002fffffffffffp+50", 0x58800001},
    {"-0x1.000002fffffffffffp+50", 0xd8800001},
    {"+0x1.00000300000000000p+50", 0x58800002},
    {"-0x1.00000300000000000p+50", 0xd8800002},
    {"+0x1.00000300000000001p+50", 0x58800002},
    {"-0x1.00000300000000001p+50", 0xd8800002},
    {"+0x1.000003fffffffffffp+50", 0x58800002},
    {"-0x1.000003fffffffffffp+50", 0xd8800002},
    {"+0x1.00000400000000000p+50", 0x58800002},
    {"-0x1.00000400000000000p+50", 0xd8800002},
    {"+0x1.00000400000000001p+50", 0x58800002},
    {"-0x1.00000400000000001p+50", 0xd8800002},
    {"+0x1.000004fffffffffffp+50", 0x58800002},
    {"-0x1.000004fffffffffffp+50", 0xd8800002},
    {"+0x1.00000500000000000p+50", 0x58800002},
    {"-0x1.00000500000000000p+50", 0xd8800002},
    {"+0x1.00000500000000001p+50", 0x58800003},
    {"-0x1.00000500000000001p+50", 0xd8800003},
    {"+0x4000004000000", 0x58800000},
    {"-0x4000004000000", 0xd8800000},
    {"+0x4000004000001", 0x58800001},
    {"-0x4000004000001", 0xd8800001},
    {"+0x4000007ffffff", 0x58800001},
    {"-0x4000007ffffff", 0xd8800001},
    {"+0x4000008000000", 0x58800001},
    {"-0x4000008000000", 0xd8800001},
    {"+0x4000008000001", 0x58800001},
    {"-0x4000008000001", 0xd8800001},
    {"+0x400000bffffff", 0x58800001},
    {"-0x400000bffffff", 0xd8800001},
    {"+0x400000c000000", 0x58800002},
    {"-0x400000c000000", 0xd8800002},
    {"+0x0.00000100000000000p-126", 0x0},
    {"-0x0.00000100000000000p-126", 0x80000000},
    {"+0x0.00000100000000001p-126", 0x1},
    {"-0x0.00000100000000001p-126", 0x80000001},
    {"+0x0.00000101000000000p-126", 0x1},
    {"+0x0.000001fffffffffffp-126", 0x1},
    {"-0x0.000001fffffffffffp-126", 0x80000001},
    {"+0x0.00000200000000000p-126", 0x1},
    {"-0x0.00000200000000000p-126", 0x80000001},
    {"+0x0.00000200000000001p-126", 0x1},
    {"-0x0.00000200000000001p-126", 0x80000001},
    {"+0x0.000002fffffffffffp-126", 0x1},
    {"-0x0.000002fffffffffffp-126", 0x80000001},
    {"+0x0.00000300000000000p-126", 0x2},
    {"-0x0.00000300000000000p-126", 0x80000002},
    {"+0x0.00000300000000001p-126", 0x2},
    {"-0x0.00000300000000001p-126", 0x80000002},
    {"+0x0.000003fffffffffffp-126", 0x2},
    {"-0x0.000003fffffffffffp-126", 0x80000002},
    {"+0x0.00000400000000000p-126", 0x2},
    {"-0x0.00000400000000000p-126", 0x80000002},
    {"+0x0.00000400000000001p-126", 0x2},
    {"-0x0.00000400000000001p-126", 0x80000002},
    {"+0x0.000004fffffffffffp-126", 0x2},
    {"-0x0.000004fffffffffffp-126", 0x80000002},
    {"+0x0.00000500000000000p-126", 0x2},
    {"-0x0.00000500000000000p-126", 0x80000002},
    {"+0x0.00000500000000001p-126", 0x3},
    {"-0x0.00000500000000001p-126", 0x80000003},
    {"+0x1.fffffe8p127", 0x7f7fffff},
    {"-0x1.fffffe8p127", 0xff7fffff},
    {"+0x1.fffffefffffff8p127", 0x7f7fffff},
    {"-0x1.fffffefffffff8p127", 0xff7fffff},
    {"+0x1.fffffefffffffffffp127", 0x7f7fffff},
    {"-0x1.fffffefffffffffffp127", 0xff7fffff},
  };

  for (auto test: kTests) {
    AssertHexFloatEquals(test.output, test.input);
  }
}